

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ConcaveCornerOption __thiscall
ON_SubDFromMeshParameters::CopyConcaveCornerTest
          (ON_SubDFromMeshParameters *this,ON_SubDFromMeshParameters source_parameters)

{
  ConcaveCornerOption CVar1;
  
  CVar1 = GetConcaveCornerOption(&source_parameters);
  SetConcaveCornerOption(this,CVar1);
  if (source_parameters.m_minimum_concave_corner_edge_count - 2 < 0xffef) {
    this->m_minimum_concave_corner_edge_count =
         source_parameters.m_minimum_concave_corner_edge_count;
  }
  if ((3.141592653589793 < source_parameters.m_minimum_concave_corner_angle_radians) &&
     (source_parameters.m_minimum_concave_corner_angle_radians <= 6.283185307179586)) {
    this->m_minimum_concave_corner_angle_radians =
         source_parameters.m_minimum_concave_corner_angle_radians;
  }
  CVar1 = GetConcaveCornerOption(this);
  return CVar1;
}

Assistant:

ON_SubDFromMeshParameters::ConcaveCornerOption ON_SubDFromMeshParameters::CopyConcaveCornerTest(
  ON_SubDFromMeshParameters source_parameters
)
{
  SetConcaveCornerOption(source_parameters.GetConcaveCornerOption());
  SetMinimumConcaveCornerEdgeCount(source_parameters.MinimumConcaveCornerEdgeCount());
  SetMinimumConcaveCornerAngleRadians(source_parameters.MinimumConcaveCornerAngleRadians());
  return GetConcaveCornerOption();
}